

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItemPrivate::QGraphicsItemPrivate(QGraphicsItemPrivate *this)

{
  undefined1 *puVar1;
  long lVar2;
  qreal *pqVar3;
  QTransform *pQVar4;
  
  this->_vptr_QGraphicsItemPrivate = (_func_int **)&PTR__QGraphicsItemPrivate_007eb3a8;
  (this->extras).d.d = (Data *)0x0;
  (this->extras).d.ptr = (ExtraStruct *)0x0;
  (this->extras).d.size = 0;
  (this->childrenBoundingRect).xp = 0.0;
  (this->childrenBoundingRect).yp = 0.0;
  (this->childrenBoundingRect).w = 0.0;
  (this->childrenBoundingRect).h = 0.0;
  (this->needsRepaint).xp = 0.0;
  (this->needsRepaint).yp = 0.0;
  (this->needsRepaint).w = 0.0;
  this->z = 0.0;
  (this->needsRepaint).h = 0.0;
  (this->paintedViewBoundingRects).d = (Data *)0x0;
  (this->pos).xp = 0.0;
  (this->pos).yp = 0.0;
  this->opacity = 1.0;
  this->scene = (QGraphicsScene *)0x0;
  this->parent = (QGraphicsItem *)0x0;
  (this->children).d.d = (Data *)0x0;
  (this->children).d.ptr = (QGraphicsItem **)0x0;
  (this->children).d.size = 0;
  this->transformData = (TransformData *)0x0;
  this->graphicsEffect = (QGraphicsEffect *)0x0;
  pqVar3 = (qreal *)&DAT_006777b8;
  pQVar4 = &this->sceneTransform;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    pQVar4->m_matrix[0][0] = *pqVar3;
    pqVar3 = pqVar3 + 1;
    pQVar4 = (QTransform *)(pQVar4->m_matrix[0] + 1);
  }
  puVar1 = &(this->sceneTransform).field_0x48;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfc00;
  this->index = -1;
  this->siblingIndex = -1;
  this->itemDepth = -1;
  this->focusProxy = (QGraphicsItem *)0x0;
  (this->focusProxyRefs).d.d = (Data *)0x0;
  (this->focusProxyRefs).d.ptr = (QGraphicsItem ***)0x0;
  (this->focusProxyRefs).d.size = 0;
  this->subFocusItem = (QGraphicsItem *)0x0;
  this->focusScopeItem = (QGraphicsItem *)0x0;
  this->imHints = (QFlagsStorageHelper<Qt::InputMethodHint,_4>)0x0;
  this->panelModality = NonModal;
  (this->gestureContext).d.d.ptr =
       (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
        *)0x0;
  *(undefined8 *)&this->field_0x160 = 0x600000000000bf;
  *(uint *)&this->field_0x168 = *(uint *)&this->field_0x168 & 0xfffff000 | 0x822;
  this->globalStackingOrder = -1;
  this->q_ptr = (QGraphicsItem *)0x0;
  return;
}

Assistant:

QGraphicsItemPrivate::QGraphicsItemPrivate()
    : z(0),
      opacity(1.),
      scene(nullptr),
      parent(nullptr),
      transformData(nullptr),
      graphicsEffect(nullptr),
      index(-1),
      siblingIndex(-1),
      itemDepth(-1),
      focusProxy(nullptr),
      subFocusItem(nullptr),
      focusScopeItem(nullptr),
      imHints(Qt::ImhNone),
      panelModality(QGraphicsItem::NonModal),
      acceptedMouseButtons(0x1f),
      visible(true),
      explicitlyHidden(false),
      enabled(true),
      explicitlyDisabled(false),
      selected(false),
      acceptsHover(false),
      acceptDrops(false),
      isMemberOfGroup(false),
      handlesChildEvents(false),
      itemDiscovered(false),
      hasCursor(false),
      ancestorFlags(0),
      cacheMode(0),
      hasBoundingRegionGranularity(false),
      isWidget(false),
      dirty(false),
      dirtyChildren(false),
      localCollisionHack(false),
      inSetPosHelper(false),
      needSortChildren(false),
      allChildrenDirty(false),
      fullUpdatePending(false),
      flags(0),
      paintedViewBoundingRectsNeedRepaint(false),
      dirtySceneTransform(true),
      geometryChanged(true),
      inDestructor(false),
      isObject(false),
      ignoreVisible(false),
      ignoreOpacity(false),
      acceptTouchEvents(false),
      acceptedTouchBeginEvent(false),
      filtersDescendantEvents(false),
      sceneTransformTranslateOnly(false),
      notifyBoundingRectChanged(false),
      notifyInvalidated(false),
      mouseSetsFocus(true),
      explicitActivate(false),
      wantsActive(false),
      holesInSiblingIndex(false),
      sequentialOrdering(true),
      updateDueToGraphicsEffect(false),
      scenePosDescendants(false),
      pendingPolish(false),
      mayHaveChildWithGraphicsEffect(false),
      sendParentChangeNotification(false),
      dirtyChildrenBoundingRect(true),
      globalStackingOrder(-1),
      q_ptr(nullptr)
{
}